

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::BlendTest
          (BlendTest *this,Context *context,GLSLVersion glslVersion,GLenum mode,bool useAllQualifier
          ,int numColors,GLfloat *colors)

{
  char *pcVar1;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  byte local_21;
  int numColors_local;
  GLSLVersion GStack_1c;
  bool useAllQualifier_local;
  GLenum mode_local;
  GLSLVersion glslVersion_local;
  Context *context_local;
  BlendTest *this_local;
  
  local_28 = numColors;
  local_21 = useAllQualifier;
  numColors_local = mode;
  GStack_1c = glslVersion;
  _mode_local = context;
  context_local = (Context *)this;
  pcVar1 = GetModeStr(mode);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar1,&local_69);
  pcVar1 = "";
  if ((local_21 & 1) != 0) {
    pcVar1 = "_all_qualifier";
  }
  std::operator+(&local_48,&local_68,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,pcVar1,"Test new blend modes for correctness.");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendTest_03264298;
  this->m_glslVersion = GStack_1c;
  this->m_mode = numColors_local;
  this->m_useAllQualifier = (bool)(local_21 & 1);
  this->m_numColors = local_28;
  this->m_colors = colors;
  return;
}

Assistant:

BlendTest(deqp::Context& context, glu::GLSLVersion glslVersion, glw::GLenum mode, bool useAllQualifier,
				  int numColors, const glw::GLfloat* colors)
			: TestCase(context, (std::string(GetModeStr(mode)) + (useAllQualifier ? "_all_qualifier" : "")).c_str(),
					   "Test new blend modes for correctness.")
			, m_glslVersion(glslVersion)
			, m_mode(mode)
			, m_useAllQualifier(useAllQualifier)
			, m_numColors(numColors)
			, m_colors(colors)
		{
		}